

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mocap.cpp
# Opt level: O1

double __thiscall
chrono::ChFunction_Mocap::LinInterp(ChFunction_Mocap *this,ChArray<> *array,double x,double x_max)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  double *pdVar4;
  double dVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar2 = this->samples;
  dVar5 = (x / x_max) * (double)iVar2;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar5;
  auVar9 = vroundsd_avx(auVar9,auVar9,9);
  uVar7 = ~((int)auVar9._0_8_ >> 0x1f) & (int)auVar9._0_8_;
  if (iVar2 <= (int)uVar7) {
    uVar7 = iVar2 - 1U;
  }
  uVar8 = 0xffffffff;
  if (-1 < (int)uVar7) {
    uVar8 = uVar7;
  }
  uVar6 = uVar8 + 1;
  if (iVar2 <= (int)(uVar8 + 1)) {
    uVar6 = iVar2 - 1U;
  }
  if (-1 < (int)uVar7) {
    lVar3 = (array->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if ((((int)uVar7 < lVar3) && (-1 < (int)uVar6)) && ((int)uVar6 < lVar3)) {
      pdVar4 = (array->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      auVar9 = vcvtdq2pd_avx(ZEXT416((uint)(int)dVar5));
      dVar5 = dVar5 - auVar9._0_8_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pdVar4[(int)uVar7];
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar5 * pdVar4[(int)uVar6];
      auVar11._8_8_ = 0;
      auVar11._0_8_ = 1.0 - dVar5;
      auVar9 = vfmadd231sd_fma(auVar10,auVar11,auVar1);
      return auVar9._0_8_;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Array<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Array<double, -1, 1>, Level = 0]"
               );
}

Assistant:

double ChFunction_Mocap::LinInterp(const ChArray<>& array, double x, double x_max) const {
    double position;
    double weightA, weightB;
    int ia, ib;

    position = ((double)samples * (x / x_max));

    ia = (int)floor(position);
    if (ia < 0) {
        ia = 0;
    };
    if (ia >= samples) {
        ia = samples - 1;
    }

    ib = ia + 1;
    if (ib < 0) {
        ib = 0;
    };
    if (ib >= samples) {
        ib = samples - 1;
    };

    weightB = position - (int)position;
    weightA = 1 - weightB;

    return (weightA * array(ia) + weightB * array(ib));
}